

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O0

void __thiscall leveldb::Table::ReadMeta(Table *this,Footer *footer)

{
  RandomAccessFile *file;
  bool bVar1;
  uint uVar2;
  int iVar3;
  BlockHandle *handle;
  Block *this_00;
  Comparator *comparator;
  Iterator *pIVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  bool local_12a;
  Slice local_d0;
  Slice local_c0;
  Slice local_b0;
  Slice local_a0;
  allocator local_89;
  string local_88 [8];
  string key;
  Iterator *iter;
  Block *meta;
  Status local_48;
  undefined1 local_40 [8];
  BlockContents contents;
  ReadOptions opt;
  Footer *footer_local;
  Table *this_local;
  
  if ((this->rep_->options).filter_policy != (FilterPolicy *)0x0) {
    ReadOptions::ReadOptions((ReadOptions *)&contents.cachable);
    if (((this->rep_->options).paranoid_checks & 1U) != 0) {
      contents.cachable = true;
    }
    BlockContents::BlockContents((BlockContents *)local_40);
    file = this->rep_->file;
    handle = Footer::metaindex_handle(footer);
    ReadBlock((leveldb *)&local_48,file,(ReadOptions *)&contents.cachable,handle,
              (BlockContents *)local_40);
    bVar1 = Status::ok(&local_48);
    Status::~Status(&local_48);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      this_00 = (Block *)operator_new(0x18);
      Block::Block(this_00,(BlockContents *)local_40);
      comparator = BytewiseComparator();
      pIVar4 = Block::NewIterator(this_00,comparator);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"filter.",&local_89);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      (*((this->rep_->options).filter_policy)->_vptr_FilterPolicy[2])();
      std::__cxx11::string::append((char *)local_88);
      Slice::Slice(&local_a0,(string *)local_88);
      (*pIVar4->_vptr_Iterator[5])(pIVar4,&local_a0);
      uVar2 = (*pIVar4->_vptr_Iterator[2])();
      local_12a = false;
      if ((uVar2 & 1) != 0) {
        iVar3 = (*pIVar4->_vptr_Iterator[8])();
        local_b0.data_ = (char *)CONCAT44(extraout_var,iVar3);
        Slice::Slice(&local_c0,(string *)local_88);
        local_12a = operator==(&local_b0,&local_c0);
      }
      if (local_12a != false) {
        iVar3 = (*pIVar4->_vptr_Iterator[9])();
        local_d0.data_ = (char *)CONCAT44(extraout_var_00,iVar3);
        ReadFilter(this,&local_d0);
      }
      if (pIVar4 != (Iterator *)0x0) {
        (*pIVar4->_vptr_Iterator[1])();
      }
      if (this_00 != (Block *)0x0) {
        Block::~Block(this_00);
        operator_delete(this_00);
      }
      std::__cxx11::string::~string(local_88);
    }
  }
  return;
}

Assistant:

void Table::ReadMeta(const Footer& footer) {
  if (rep_->options.filter_policy == nullptr) {
    return;  // Do not need any metadata
  }

  // TODO(sanjay): Skip this if footer.metaindex_handle() size indicates
  // it is an empty block.
  ReadOptions opt;
  if (rep_->options.paranoid_checks) {
    opt.verify_checksums = true;
  }
  BlockContents contents;
  if (!ReadBlock(rep_->file, opt, footer.metaindex_handle(), &contents).ok()) {
    // Do not propagate errors since meta info is not needed for operation
    return;
  }
  Block* meta = new Block(contents);

  Iterator* iter = meta->NewIterator(BytewiseComparator());
  std::string key = "filter.";
  key.append(rep_->options.filter_policy->Name());
  iter->Seek(key);
  if (iter->Valid() && iter->key() == Slice(key)) {
    ReadFilter(iter->value());
  }
  delete iter;
  delete meta;
}